

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O2

size_type __thiscall bitdeque<32768>::size(bitdeque<32768> *this)

{
  long lVar1;
  size_type sVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::deque<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::size
                    (&this->m_deque);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar2 * 0x8000 - ((long)this->m_pad_begin + (long)this->m_pad_end);
  }
  __stack_chk_fail();
}

Assistant:

size_type size() const noexcept { return m_deque.size() * BITS_PER_WORD - m_pad_begin - m_pad_end; }